

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextProfiler.cpp
# Opt level: O3

void __thiscall Js::ScriptContextProfiler::ProfilePrint(ScriptContextProfiler *this)

{
  Phase PVar1;
  ScriptContextProfiler *profiler;
  
  if (DAT_015bc46a == '\0') {
    do {
      profiler = this->next;
      if (this->profilerArena != (ArenaAllocator *)0x0) {
        for (; profiler != (ScriptContextProfiler *)0x0; profiler = profiler->next) {
          if (profiler->profilerArena != (ArenaAllocator *)0x0) {
            ProfileMerge(this,profiler);
          }
        }
        PVar1 = Phases::GetFirstPhase((Phases *)&DAT_015ada90);
        ProfilePrint(this,PVar1);
        return;
      }
      this = profiler;
    } while (profiler != (ScriptContextProfiler *)0x0);
  }
  else {
    do {
      PVar1 = Phases::GetFirstPhase((Phases *)&DAT_015ada90);
      ProfilePrint(this,PVar1);
      this = this->next;
    } while (this != (ScriptContextProfiler *)0x0);
  }
  return;
}

Assistant:

void
    ScriptContextProfiler::ProfilePrint()
    {
        Js::ScriptContextProfiler* profiler = this;
        if (Js::Configuration::Global.flags.Verbose)
        {
            //Print individual profiler information in verbose mode
            while (profiler)
            {
                profiler->ProfilePrint(Js::Configuration::Global.flags.Profile.GetFirstPhase());
                profiler = profiler->next;
            }
        }
        else
        {
            //Merge all the profiler for single snapshot.
            Js::ScriptContextProfiler* mergeToProfiler = profiler;

            // find the first initialized profiler
            while (mergeToProfiler != nullptr && !mergeToProfiler->IsInitialized())
            {
                mergeToProfiler = mergeToProfiler->next;
            }
            if (mergeToProfiler != nullptr)
            {
                // merge the rest profiler to the above initialized profiler
                profiler = mergeToProfiler->next;
                while (profiler)
                {
                    if (profiler->IsInitialized())
                    {
                        mergeToProfiler->ProfileMerge(profiler);
                    }
                    profiler = profiler->next;
                }
                mergeToProfiler->ProfilePrint(Js::Configuration::Global.flags.Profile.GetFirstPhase());
            }
        }
    }